

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

bool __thiscall slang::parsing::Token::isOnSameLine(Token *this)

{
  TriviaKind TVar1;
  pointer pTVar2;
  size_type sVar3;
  long lVar4;
  bool bVar5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  sVar6 = trivia(this);
  pTVar2 = sVar6._M_ptr;
  bVar5 = sVar6._M_extent._M_extent_value._M_extent_value == 0;
  if (!bVar5) {
    lVar4 = 0;
    do {
      TVar1 = (&pTVar2->kind)[lVar4];
      if (TVar1 < (Directive|Whitespace)) {
        if (TVar1 == BlockComment) {
          if ((byte)((&pTVar2->kind)[lVar4] - SkippedTokens) < 3) {
            local_40._M_str = "";
            local_40._M_len = 0;
          }
          else {
            local_40._M_str = *(char **)((long)&pTVar2->field_0 + lVar4);
            if ((&pTVar2->hasFullLocation)[lVar4] == true) {
              local_40._M_len = *(size_t *)local_40._M_str;
              local_40._M_str = *(char **)((long)local_40._M_str + 8);
            }
            else {
              local_40._M_len = (size_t)*(uint *)((long)&pTVar2->field_0 + lVar4 + 8);
            }
          }
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                            (&local_40,"\r\n",0,2);
          if (sVar3 != 0xffffffffffffffff) {
            return bVar5;
          }
        }
        else if (TVar1 == 8) {
          if (**(int **)((long)&pTVar2->field_0 + lVar4) != 0x126) {
            return bVar5;
          }
        }
        else if ((0xecU >> (TVar1 & 0x1f) & 1) != 0) {
          return bVar5;
        }
      }
      lVar4 = lVar4 + 0x10;
      bVar5 = sVar6._M_extent._M_extent_value._M_extent_value << 4 == lVar4;
    } while (!bVar5);
  }
  return bVar5;
}

Assistant:

bool Token::isOnSameLine() const {
    for (auto& t : trivia()) {
        switch (t.kind) {
            case TriviaKind::LineComment:
            case TriviaKind::EndOfLine:
            case TriviaKind::SkippedSyntax:
            case TriviaKind::SkippedTokens:
            case TriviaKind::DisabledText:
                return false;
            case TriviaKind::Directive:
                if (t.syntax()->kind != SyntaxKind::MacroUsage)
                    return false;
                break;
            case TriviaKind::BlockComment:
                if (size_t offset = t.getRawText().find_first_of("\r\n");
                    offset != std::string_view::npos) {
                    return false;
                }
                break;
            default:
                break;
        }
    }
    return true;
}